

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

void __thiscall
cmQtAutoMocUic::JobT::LogCommandError
          (JobT *this,GenT genType,string *message,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *output)

{
  void *pvVar1;
  
  pvVar1 = ((this->super_JobT).Pool_)->UserData_;
  LOCK();
  *(undefined1 *)((long)pvVar1 + 0x808) = 1;
  UNLOCK();
  cmWorkerPool::Abort((cmWorkerPool *)((long)pvVar1 + 0x810));
  cmQtAutoGenerator::Logger::ErrorCommand
            ((Logger *)((long)((this->super_JobT).Pool_)->UserData_ + 0x70),genType,message,command,
             output);
  return;
}

Assistant:

void cmQtAutoMocUic::JobT::LogCommandError(
  GenT genType, std::string const& message,
  std::vector<std::string> const& command, std::string const& output) const
{
  Gen()->AbortError();
  Gen()->Log().ErrorCommand(genType, message, command, output);
}